

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

_Bool deltaq_params_have_changed
                (DeltaQuantParams *prev_deltaq_params,CommonQuantParams *quant_params)

{
  _Bool local_11;
  CommonQuantParams *quant_params_local;
  DeltaQuantParams *prev_deltaq_params_local;
  
  local_11 = true;
  if ((((prev_deltaq_params->y_dc_delta_q == quant_params->y_dc_delta_q) &&
       (local_11 = true, prev_deltaq_params->u_dc_delta_q == quant_params->u_dc_delta_q)) &&
      (local_11 = true, prev_deltaq_params->v_dc_delta_q == quant_params->v_dc_delta_q)) &&
     ((local_11 = true, prev_deltaq_params->u_ac_delta_q == quant_params->u_ac_delta_q &&
      (local_11 = true, prev_deltaq_params->v_ac_delta_q == quant_params->v_ac_delta_q)))) {
    local_11 = prev_deltaq_params->sharpness != quant_params->sharpness;
  }
  return local_11;
}

Assistant:

static inline bool deltaq_params_have_changed(
    const DeltaQuantParams *prev_deltaq_params,
    const CommonQuantParams *quant_params) {
  return (prev_deltaq_params->y_dc_delta_q != quant_params->y_dc_delta_q ||
          prev_deltaq_params->u_dc_delta_q != quant_params->u_dc_delta_q ||
          prev_deltaq_params->v_dc_delta_q != quant_params->v_dc_delta_q ||
          prev_deltaq_params->u_ac_delta_q != quant_params->u_ac_delta_q ||
          prev_deltaq_params->v_ac_delta_q != quant_params->v_ac_delta_q ||
          prev_deltaq_params->sharpness != quant_params->sharpness);
}